

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

int cmSystemTools::WaitForLine
              (cmsysProcess *process,string *line,double timeout,
              vector<char,_std::allocator<char>_> *out,vector<char,_std::allocator<char>_> *err)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  int iVar4;
  long lVar5;
  char *pcVar6;
  const_iterator cVar7;
  pointer pcVar8;
  char *pcVar9;
  int length;
  string *local_50;
  char *data;
  cmsysProcess *local_40;
  double timeout_local;
  
  local_40 = process;
  timeout_local = timeout;
  std::__cxx11::string::assign((char *)line);
  pcVar9 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pcVar6 = (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  do {
    pcVar2 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
    lVar5 = -(long)pcVar9;
    for (; pcVar3 = pcVar2, pcVar9 != pcVar2; pcVar9 = pcVar9 + 1) {
      cVar1 = *pcVar9;
      if (cVar1 == '\r') {
        pcVar3 = pcVar9;
        if (pcVar9 + 1 == pcVar2) break;
      }
      else if ((cVar1 == '\0') || (cVar1 == '\n')) {
        cVar7._M_current =
             (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
             _M_start;
        if ((1 < (ulong)-(long)(cVar7._M_current + lVar5)) || (pcVar9 != cVar7._M_current)) {
          std::__cxx11::string::append((char *)line,(ulong)cVar7._M_current);
          cVar7._M_current =
               (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start;
        }
        std::vector<char,_std::allocator<char>_>::erase(out,cVar7,(const_iterator)(pcVar9 + 1));
        return 2;
      }
      lVar5 = lVar5 + -1;
    }
    pcVar9 = pcVar3;
    pcVar2 = (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
    lVar5 = -(long)pcVar6;
    for (; pcVar3 = pcVar2, pcVar6 != pcVar2; pcVar6 = pcVar6 + 1) {
      cVar1 = *pcVar6;
      if (cVar1 == '\r') {
        pcVar3 = pcVar6;
        if (pcVar6 + 1 == pcVar2) break;
      }
      else if ((cVar1 == '\0') || (cVar1 == '\n')) {
        cVar7._M_current =
             (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
             _M_start;
        if ((1 < (ulong)-(long)(cVar7._M_current + lVar5)) || (pcVar6 != cVar7._M_current)) {
          std::__cxx11::string::append((char *)line,(ulong)cVar7._M_current);
          cVar7._M_current =
               (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start;
        }
        std::vector<char,_std::allocator<char>_>::erase(err,cVar7,(const_iterator)(pcVar6 + 1));
        return 3;
      }
      lVar5 = lVar5 + -1;
    }
    pcVar6 = pcVar3;
    local_50 = line;
    iVar4 = cmsysProcess_WaitForData(local_40,&data,&length,&timeout_local);
    if (iVar4 == 2) {
      cVar7._M_current =
           (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
      pcVar8 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      std::vector<char,std::allocator<char>>::insert<char*,void>
                ((vector<char,std::allocator<char>> *)out,cVar7,data,data + length);
      pcVar9 = cVar7._M_current +
               ((long)(out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                      super__Vector_impl_data._M_start - (long)pcVar8);
      line = local_50;
    }
    else if (iVar4 == 3) {
      cVar7._M_current =
           (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
      pcVar8 = (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      std::vector<char,std::allocator<char>>::insert<char*,void>
                ((vector<char,std::allocator<char>> *)err,cVar7,data,data + length);
      pcVar6 = cVar7._M_current +
               ((long)(err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                      super__Vector_impl_data._M_start - (long)pcVar8);
      line = local_50;
    }
    else {
      if (iVar4 == 0) {
        pcVar8 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if (pcVar8 == (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                      super__Vector_impl_data._M_finish) {
          pcVar8 = (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          if (pcVar8 == (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                        super__Vector_impl_data._M_finish) {
            return 0;
          }
          iVar4 = 3;
          out = err;
        }
        else {
          iVar4 = 2;
        }
        std::__cxx11::string::append((char *)local_50,(ulong)pcVar8);
        std::vector<char,_std::allocator<char>_>::erase
                  (out,(const_iterator)
                       (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                       super__Vector_impl_data._M_start,
                   (const_iterator)
                   (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                   super__Vector_impl_data._M_finish);
        return iVar4;
      }
      line = local_50;
      if (iVar4 == 0xff) {
        return 0xff;
      }
    }
  } while( true );
}

Assistant:

int cmSystemTools::WaitForLine(cmsysProcess* process, std::string& line,
                               double timeout,
                               std::vector<char>& out,
                               std::vector<char>& err)
{
  line = "";
  std::vector<char>::iterator outiter = out.begin();
  std::vector<char>::iterator erriter = err.begin();
  while(1)
    {
    // Check for a newline in stdout.
    for(;outiter != out.end(); ++outiter)
      {
      if((*outiter == '\r') && ((outiter+1) == out.end()))
        {
        break;
        }
      else if(*outiter == '\n' || *outiter == '\0')
        {
        std::vector<char>::size_type length = outiter-out.begin();
        if(length > 1 && *(outiter-1) == '\r')
          {
          --length;
          }
        if(length > 0)
          {
          line.append(&out[0], length);
          }
        out.erase(out.begin(), outiter+1);
        return cmsysProcess_Pipe_STDOUT;
        }
      }

    // Check for a newline in stderr.
    for(;erriter != err.end(); ++erriter)
      {
      if((*erriter == '\r') && ((erriter+1) == err.end()))
        {
        break;
        }
      else if(*erriter == '\n' || *erriter == '\0')
        {
        std::vector<char>::size_type length = erriter-err.begin();
        if(length > 1 && *(erriter-1) == '\r')
          {
          --length;
          }
        if(length > 0)
          {
          line.append(&err[0], length);
          }
        err.erase(err.begin(), erriter+1);
        return cmsysProcess_Pipe_STDERR;
        }
      }

    // No newlines found.  Wait for more data from the process.
    int length;
    char* data;
    int pipe = cmsysProcess_WaitForData(process, &data, &length, &timeout);
    if(pipe == cmsysProcess_Pipe_Timeout)
      {
      // Timeout has been exceeded.
      return pipe;
      }
    else if(pipe == cmsysProcess_Pipe_STDOUT)
      {
      // Append to the stdout buffer.
      std::vector<char>::size_type size = out.size();
      out.insert(out.end(), data, data+length);
      outiter = out.begin()+size;
      }
    else if(pipe == cmsysProcess_Pipe_STDERR)
      {
      // Append to the stderr buffer.
      std::vector<char>::size_type size = err.size();
      err.insert(err.end(), data, data+length);
      erriter = err.begin()+size;
      }
    else if(pipe == cmsysProcess_Pipe_None)
      {
      // Both stdout and stderr pipes have broken.  Return leftover data.
      if(!out.empty())
        {
        line.append(&out[0], outiter-out.begin());
        out.erase(out.begin(), out.end());
        return cmsysProcess_Pipe_STDOUT;
        }
      else if(!err.empty())
        {
        line.append(&err[0], erriter-err.begin());
        err.erase(err.begin(), err.end());
        return cmsysProcess_Pipe_STDERR;
        }
      else
        {
        return cmsysProcess_Pipe_None;
        }
      }
    }
}